

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexExpanderShader::shadeFragments
          (VertexExpanderShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  GenericVec4 *pGVar1;
  int iVar2;
  int fragNdx;
  int fragNdx_00;
  FragmentPacket *packet;
  ulong uVar3;
  ulong uVar4;
  deUint32 local_50;
  deUint32 local_4c;
  deUint32 local_48;
  deUint32 local_44;
  FragmentPacket *local_40;
  ulong local_38;
  
  uVar4 = 0;
  local_38 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    local_38 = uVar4;
  }
  local_40 = packets;
  for (uVar3 = 0; uVar3 != local_38; uVar3 = uVar3 + 1) {
    packet = local_40 + uVar3;
    for (fragNdx_00 = 0; fragNdx_00 != 4; fragNdx_00 = fragNdx_00 + 1) {
      rr::readVarying<float>((rr *)&local_50,packet,context,0,fragNdx_00);
      iVar2 = ((int)uVar4 + fragNdx_00) * context->numFragmentOutputs;
      pGVar1 = context->outputArray;
      pGVar1[iVar2].v.uData[0] = local_50;
      pGVar1[iVar2].v.uData[1] = local_4c;
      pGVar1[iVar2].v.uData[2] = local_48;
      pGVar1[iVar2].v.uData[3] = local_44;
    }
    uVar4 = (ulong)((int)uVar4 + 4);
  }
  return;
}

Assistant:

void VertexExpanderShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, rr::readVarying<float>(packets[packetNdx], context, 0, fragNdx));
}